

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotHLines<float>(char *label_id,float *ys,int count,int offset,int stride)

{
  float fVar1;
  double dVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  ImPlotRange *pIVar6;
  ImPlotContext *pIVar7;
  bool bVar8;
  ImU32 col;
  ImDrawList *DrawList;
  int iVar9;
  int iVar10;
  double dVar11;
  GetterXRefYs<float> get_max;
  GetterXRefYs<float> get_min;
  ImPlotLimits lims;
  TransformerLinLin local_94;
  GetterXRefYs<float> local_90;
  GetterXRefYs<float> local_70;
  ImPlotLimits local_50;
  
  iVar10 = 0;
  bVar8 = BeginItem(label_id,0);
  if (bVar8) {
    GetPlotLimits(&local_50,-1);
    pIVar7 = GImPlot;
    local_70.XRef = local_50.X.Min;
    if (count != 0) {
      iVar10 = (offset % count + count) % count;
    }
    local_90.XRef = local_50.X.Max;
    if (count == 0) {
      local_90.Offset = 0;
    }
    else {
      local_90.Offset = (offset % count + count) % count;
    }
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      pIVar4 = GImPlot->CurrentPlot;
      iVar3 = pIVar4->CurrentYAxis;
      pIVar6 = GImPlot->ExtentsY;
      iVar9 = 0;
      do {
        fVar1 = *(float *)((long)ys +
                          (long)(((iVar10 + iVar9) % count + count) % count) * (long)stride);
        dVar5 = (double)fVar1;
        if (((long)ABS(dVar5) < 0x7ff0000000000000) &&
           ((0.0 < fVar1 || ((pIVar4->YAxis[iVar3].Flags & 0x20U) == 0)))) {
          dVar2 = pIVar6[iVar3].Min;
          dVar11 = dVar5;
          if (dVar2 <= dVar5) {
            dVar11 = dVar2;
          }
          pIVar6[iVar3].Min = dVar11;
          dVar2 = pIVar7->ExtentsY[iVar3].Max;
          if (dVar5 <= dVar2) {
            dVar5 = dVar2;
          }
          pIVar7->ExtentsY[iVar3].Max = dVar5;
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    local_90.Ys = ys;
    local_90.Count = count;
    local_90.Stride = stride;
    local_70.Ys = ys;
    local_70.Count = count;
    local_70.Offset = iVar10;
    local_70.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar7->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar7->NextItemData).Colors);
      iVar10 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar10]) {
      case 0:
        local_94.YAxis = iVar10;
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLinLin>
                  (&local_70,&local_90,&local_94,DrawList,(pIVar7->NextItemData).LineWeight,col);
        break;
      case 1:
        local_94.YAxis = iVar10;
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLogLin>
                  (&local_70,&local_90,(TransformerLogLin *)&local_94,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
        break;
      case 2:
        local_94.YAxis = iVar10;
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLinLog>
                  (&local_70,&local_90,(TransformerLinLog *)&local_94,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
        break;
      case 3:
        local_94.YAxis = iVar10;
        RenderLineSegments<ImPlot::GetterXRefYs<float>,ImPlot::GetterXRefYs<float>,ImPlot::TransformerLogLog>
                  (&local_70,&local_90,(TransformerLogLog *)&local_94,DrawList,
                   (pIVar7->NextItemData).LineWeight,col);
      }
    }
    pIVar7 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar7->NextItemData);
    pIVar7->PreviousItem = pIVar7->CurrentItem;
    pIVar7->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotHLines(const char* label_id, const T* ys, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXRefYs<T> get_min(lims.X.Min,ys,count,offset,stride);
        GetterXRefYs<T> get_max(lims.X.Max,ys,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointY(get_min(i).y);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}